

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::TypedefDeclarationSyntax::TypedefDeclarationSyntax
          (TypedefDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token typedefKeyword,
          DataTypeSyntax *type,Token name,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,Token semi)

{
  Token TVar1;
  Token TVar2;
  DataTypeSyntax *pDVar3;
  iterator ppVVar4;
  VariableDimensionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *__range2;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *local_38;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions_local;
  DataTypeSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  TypedefDeclarationSyntax *this_local;
  Token typedefKeyword_local;
  
  TVar2 = semi;
  TVar1 = name;
  typedefKeyword_local._0_8_ = typedefKeyword.info;
  this_local = typedefKeyword._0_8_;
  local_38 = dimensions;
  dimensions_local = (SyntaxList<slang::syntax::VariableDimensionSyntax> *)type;
  type_local = (DataTypeSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,TypedefDeclaration,attributes);
  *(TypedefDeclarationSyntax **)&this->typedefKeyword = this_local;
  (this->typedefKeyword).info = (Info *)typedefKeyword_local._0_8_;
  __range2 = dimensions_local;
  not_null<slang::syntax::DataTypeSyntax*>::not_null<slang::syntax::DataTypeSyntax*,void>
            ((not_null<slang::syntax::DataTypeSyntax*> *)&this->type,(DataTypeSyntax **)&__range2);
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  name.info = TVar1.info;
  (this->name).info = name.info;
  SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList(&this->dimensions,local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar2.info;
  (this->semi).info = semi.info;
  pDVar3 = not_null<slang::syntax::DataTypeSyntax_*>::operator->(&this->type);
  (pDVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
           ::begin(&(this->dimensions).
                    super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>);
  ppVVar4 = nonstd::span_lite::
            span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::end
                      (&(this->dimensions).
                        super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                      );
  for (; __end2 != ppVVar4; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

TypedefDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token typedefKeyword, DataTypeSyntax& type, Token name, const SyntaxList<VariableDimensionSyntax>& dimensions, Token semi) :
        MemberSyntax(SyntaxKind::TypedefDeclaration, attributes), typedefKeyword(typedefKeyword), type(&type), name(name), dimensions(dimensions), semi(semi) {
        this->type->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }